

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enumerate_example.cpp
# Opt level: O2

void enumerate_examples(void)

{
  pointer pIVar1;
  ostream *poVar2;
  long lVar3;
  vector<(anonymous_namespace)::Integer,_std::allocator<(anonymous_namespace)::Integer>_> elements;
  undefined8 local_3c;
  undefined4 local_34;
  
  std::operator<<((ostream *)&std::cout,"enumerate examples\n");
  local_3c = 0x100000000;
  local_34 = 2;
  elements.
  super__Vector_base<(anonymous_namespace)::Integer,_std::allocator<(anonymous_namespace)::Integer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  elements.
  super__Vector_base<(anonymous_namespace)::Integer,_std::allocator<(anonymous_namespace)::Integer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  elements.
  super__Vector_base<(anonymous_namespace)::Integer,_std::allocator<(anonymous_namespace)::Integer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar1 = (pointer)operator_new(0xc);
  elements.
  super__Vector_base<(anonymous_namespace)::Integer,_std::allocator<(anonymous_namespace)::Integer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pIVar1 + 3;
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
    *(undefined4 *)((long)&pIVar1->i + lVar3) = *(undefined4 *)((long)&local_3c + lVar3);
  }
  elements.
  super__Vector_base<(anonymous_namespace)::Integer,_std::allocator<(anonymous_namespace)::Integer>_>
  ._M_impl.super__Vector_impl_data._M_finish = pIVar1 + 3;
  elements.
  super__Vector_base<(anonymous_namespace)::Integer,_std::allocator<(anonymous_namespace)::Integer>_>
  ._M_impl.super__Vector_impl_data._M_start = pIVar1;
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)&pIVar1->i + lVar3));
    std::operator<<(poVar2," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<(anonymous_namespace)::Integer,_std::allocator<(anonymous_namespace)::Integer>_>
  ::~_Vector_base(&elements.
                   super__Vector_base<(anonymous_namespace)::Integer,_std::allocator<(anonymous_namespace)::Integer>_>
                 );
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void enumerate_examples() {
  std::cout << "enumerate examples\n";

  enumerate_example();

  std::cout << std::endl;
}